

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabFloat(float *fp)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  float *fp_local;
  
  uVar1 = *(undefined1 *)((long)fp + 3);
  *(undefined1 *)((long)fp + 3) = *(undefined1 *)fp;
  *(undefined1 *)fp = uVar1;
  uVar1 = *(undefined1 *)((long)fp + 2);
  *(undefined1 *)((long)fp + 2) = *(undefined1 *)((long)fp + 1);
  *(undefined1 *)((long)fp + 1) = uVar1;
  return;
}

Assistant:

void TIFFSwabFloat(float *fp)
{
    register unsigned char *cp = (unsigned char *)fp;
    unsigned char t;
    assert(sizeof(float) == 4);
    t = cp[3];
    cp[3] = cp[0];
    cp[0] = t;
    t = cp[2];
    cp[2] = cp[1];
    cp[1] = t;
}